

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O1

bool copy_accessed_types(DatabaseInterface *input_db,DatabaseInterface *output_db,
                        vector<unsigned_char,_std::allocator<unsigned_char>_> *state_json,
                        unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                        *accessed,ResourceTag tag,uint *per_tag_written)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  pointer puVar3;
  bool bVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar5;
  byte bVar6;
  int iVar7;
  size_t compressed_size;
  size_type local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_48;
  DatabaseInterface *local_40;
  DatabaseInterface *local_38;
  
  per_tag_written[tag] = (uint)(accessed->_M_h)._M_element_count;
  p_Var1 = (accessed->_M_h)._M_before_begin._M_nxt;
  local_40 = output_db;
  local_48 = state_json;
  while( true ) {
    bVar4 = p_Var1 == (_Hash_node_base *)0x0;
    if (bVar4) {
      return bVar4;
    }
    p_Var2 = p_Var1[1]._M_nxt;
    local_50 = 0;
    local_38 = input_db;
    iVar7 = (*input_db->_vptr_DatabaseInterface[3])(input_db,(ulong)tag,p_Var2,&local_50,0,1);
    pvVar5 = local_48;
    if ((char)iVar7 == '\0') {
      bVar6 = 1;
      if (tag == RESOURCE_SHADER_MODULE) {
        fprintf(_stderr,
                "Fossilize ERROR: Reference shader module %016lx does not exist in database.\n",
                p_Var2);
        bVar6 = 3;
      }
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(local_48,local_50);
      bVar6 = 1;
      iVar7 = (*input_db->_vptr_DatabaseInterface[3])
                        (input_db,(ulong)tag,p_Var2,&local_50,
                         (pvVar5->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                         ._M_impl.super__Vector_impl_data._M_start,1);
      if ((char)iVar7 != '\0') {
        puVar3 = (local_48->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        iVar7 = (*local_40->_vptr_DatabaseInterface[4])
                          (local_40,(ulong)tag,p_Var2,puVar3,
                           (long)(local_48->
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar3,1);
        bVar6 = (byte)iVar7 ^ 1;
      }
    }
    if ((bVar6 != 3) && (bVar6 != 0)) break;
    p_Var1 = p_Var1->_M_nxt;
    input_db = local_38;
  }
  return bVar4;
}

Assistant:

static bool copy_accessed_types(DatabaseInterface &input_db,
                                DatabaseInterface &output_db,
                                vector<uint8_t> &state_json,
                                const unordered_set<Hash> &accessed,
                                ResourceTag tag,
                                unsigned *per_tag_written)
{
	per_tag_written[tag] = accessed.size();
	for (auto hash : accessed)
	{
		size_t compressed_size = 0;
		if (!input_db.read_entry(tag, hash, &compressed_size, nullptr, PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT))
		{
			if (tag == RESOURCE_SHADER_MODULE)
			{
				// We did not resolve shader module references, so we might hit an error here, but that's fine.
				LOGE("Reference shader module %016" PRIx64 " does not exist in database.\n", hash);
				continue;
			}
			else
				return false;
		}

		state_json.resize(compressed_size);

		if (!input_db.read_entry(tag, hash, &compressed_size, state_json.data(), PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT))
			return false;
		if (!output_db.write_entry(tag, hash, state_json.data(), state_json.size(), PAYLOAD_WRITE_RAW_FOSSILIZE_DB_BIT))
			return false;
	}
	return true;
}